

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

void us_internal_init_loop_ssl_data(us_loop_t *loop)

{
  void *pvVar1;
  void *pvVar2;
  BIO_METHOD *type;
  BIO *pBVar3;
  BIO *pBVar4;
  
  if ((loop->data).ssl_data != (void *)0x0) {
    return;
  }
  pvVar1 = malloc(0x50);
  pvVar2 = malloc(0x80040);
  *(void **)((long)pvVar1 + 8) = pvVar2;
  OPENSSL_init_ssl(0,0);
  type = (BIO_METHOD *)BIO_meth_new(0x401,anon_var_dwarf_30fb);
  *(BIO_METHOD **)((long)pvVar1 + 0x48) = type;
  BIO_meth_set_create(type,BIO_s_custom_create);
  BIO_meth_set_write(type,BIO_s_custom_write);
  BIO_meth_set_read(type,BIO_s_custom_read);
  BIO_meth_set_ctrl(type,BIO_s_custom_ctrl);
  pBVar3 = BIO_new(type);
  *(BIO **)((long)pvVar1 + 0x38) = pBVar3;
  pBVar4 = BIO_new(type);
  *(BIO **)((long)pvVar1 + 0x40) = pBVar4;
  BIO_set_data(pBVar3,pvVar1);
  BIO_set_data(*(undefined8 *)((long)pvVar1 + 0x40),pvVar1);
  *(undefined8 *)((long)pvVar1 + 0x28) = 0;
  *(undefined4 *)((long)pvVar1 + 0x30) = 5;
  (loop->data).ssl_data = pvVar1;
  return;
}

Assistant:

void us_internal_init_loop_ssl_data(struct us_loop_t *loop) {
    if (!loop->data.ssl_data) {
        struct loop_ssl_data *loop_ssl_data = malloc(sizeof(struct loop_ssl_data));

        loop_ssl_data->ssl_read_output = malloc(LIBUS_RECV_BUFFER_LENGTH + LIBUS_RECV_BUFFER_PADDING * 2);

        OPENSSL_init_ssl(0, NULL);

        loop_ssl_data->shared_biom = BIO_meth_new(BIO_TYPE_MEM, "µS BIO");
        BIO_meth_set_create(loop_ssl_data->shared_biom, BIO_s_custom_create);
        BIO_meth_set_write(loop_ssl_data->shared_biom, BIO_s_custom_write);
        BIO_meth_set_read(loop_ssl_data->shared_biom, BIO_s_custom_read);
        BIO_meth_set_ctrl(loop_ssl_data->shared_biom, BIO_s_custom_ctrl);

        loop_ssl_data->shared_rbio = BIO_new(loop_ssl_data->shared_biom);
        loop_ssl_data->shared_wbio = BIO_new(loop_ssl_data->shared_biom);
        BIO_set_data(loop_ssl_data->shared_rbio, loop_ssl_data);
        BIO_set_data(loop_ssl_data->shared_wbio, loop_ssl_data);

        // reset handshake budget (doesn't matter what loop nr we start on)
        loop_ssl_data->last_iteration_nr = 0;
        loop_ssl_data->handshake_budget = MAX_HANDSHAKES_PER_LOOP_ITERATION;

        loop->data.ssl_data = loop_ssl_data;
    }
}